

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

bool __thiscall
trial::protocol::buffer::vector<char,_std::allocator<char>_>::grow
          (vector<char,_std::allocator<char>_> *this,size_type delta)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pcVar1;
  bool bVar2;
  pointer __n;
  
  this_00 = this->buffer;
  pcVar1 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __n = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish + (delta - (long)pcVar1);
  bVar2 = true;
  if ((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage + -(long)pcVar1 < __n) {
    if ((long)__n < 0) {
      bVar2 = false;
    }
    else {
      std::vector<char,_std::allocator<char>_>::reserve(this_00,(size_type)__n);
    }
  }
  return bVar2;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = buffer.size() + delta;
        if (size > buffer.capacity())
        {
            if (size > buffer.max_size())
                return false;
            buffer.reserve(size);
        }
        return true;
    }